

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

bool __thiscall QAccessibleTabButton::isValid(QAccessibleTabButton *this)

{
  bool bVar1;
  int iVar2;
  QWidgetPrivate *pQVar3;
  QTabBar *in_RDI;
  QTabBar *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QTabBar> *)0x7d6b4f);
  if (bVar1) {
    QPointer<QTabBar>::data((QPointer<QTabBar> *)0x7d6b62);
    pQVar3 = QWidget::d_func((QWidget *)0x7d6b6a);
    if ((*(uint *)&(pQVar3->data).field_0x10 >> 0x12 & 1) == 0) {
      QPointer<QTabBar>::operator->((QPointer<QTabBar> *)0x7d6b8f);
      iVar2 = QTabBar::count(this_00);
      local_1 = *(int *)&(in_RDI->super_QWidget).data < iVar2;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool isValid() const override {
        if (m_parent) {
            if (static_cast<QWidget *>(m_parent.data())->d_func()->data.in_destructor)
                return false;
            return m_parent->count() > m_index;
        }
        return false;
    }